

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
  PVar2;
  initializer_list<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
  __l;
  allocator_type local_91;
  vector<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>
  local_90;
  tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
  local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_78.
  super__Tuple_impl<0UL,_int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
  .super__Head_base<0UL,_int,_false>._M_head_impl = *(int *)(in_RSI + 2);
  local_78.
  super__Tuple_impl<0UL,_int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
  .
  super__Tuple_impl<1UL,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
  .super__Tuple_impl<2UL,_int_(*)(const_short_*,_const_short_*,_int)>.
  super__Head_base<2UL,_int_(*)(const_short_*,_const_short_*,_int),_false>._M_head_impl =
       (_Head_base<2UL,_int_(*)(const_short_*,_const_short_*,_int),_false>)*in_RSI;
  local_78.
  super__Tuple_impl<0UL,_int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
  .
  super__Tuple_impl<1UL,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
  .super__Head_base<1UL,_int_(*)(const_short_*,_const_short_*,_int),_false>._M_head_impl =
       (_func_int_short_ptr_short_ptr_int *)in_RSI[1];
  local_50 = *(undefined4 *)(in_RSI + 5);
  local_60 = in_RSI[3];
  uStack_58 = in_RSI[4];
  local_48 = in_RSI[6];
  uStack_40 = in_RSI[7];
  local_38 = *(undefined4 *)(in_RSI + 8);
  local_30 = in_RSI[9];
  uStack_28 = in_RSI[10];
  local_20 = *(undefined4 *)(in_RSI + 0xb);
  __l._M_len = 4;
  __l._M_array = &local_78;
  std::
  vector<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>
  ::vector(&local_90,__l,&local_91);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<std::tuple<int,int(*)(short_const*,short_const*,int),int(*)(short_const*,short_const*,int)>const*,std::vector<std::tuple<int,int(*)(short_const*,short_const*,int),int(*)(short_const*,short_const*,int)>,std::allocator<std::tuple<int,int(*)(short_const*,short_const*,int),int(*)(short_const*,short_const*,int)>>>>>
                    ((testing *)this,
                     (__normal_iterator<const_std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_*,_std::vector<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>_>
                      )local_90.
                       super__Vector_base<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_*,_std::vector<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>_>
                      )local_90.
                       super__Vector_base<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_90.
      super__Vector_base<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>
       *)0x0) {
    operator_delete(local_90.
                    super__Vector_base<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>,_std::allocator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }